

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_retrieveDuplicateIdItemsWithIndex_Test::TestBody
          (Annotator_retrieveDuplicateIdItemsWithIndex_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  allocator<std::pair<libcellml::CellmlElementType,_std::any>_> *this_02;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  *this_03;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_00;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_01;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  bool bVar1;
  undefined4 uVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  reference __k;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  mapped_type *pmVar8;
  reference lhs;
  pair<libcellml::CellmlElementType,_std::any> *local_1970;
  pair<libcellml::CellmlElementType,_std::any> *local_1958;
  pair<libcellml::CellmlElementType,_std::any> *local_1940;
  pair<libcellml::CellmlElementType,_std::any> *local_1928;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *local_1910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_15a8;
  AssertHelper local_1558 [8];
  Message local_1550 [8];
  shared_ptr<libcellml::Variable> local_1548;
  any local_1538;
  undefined1 local_1528 [8];
  AssertionResult gtest_ar_13;
  Message local_1510 [8];
  shared_ptr<libcellml::Units> local_1508;
  any local_14f8;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_12;
  Message local_14d0 [8];
  unsigned_long local_14c8;
  unsigned_long local_14c0;
  undefined1 local_14b8 [8];
  AssertionResult gtest_ar_11;
  Message local_14a0 [8];
  shared_ptr<libcellml::Units> local_1498;
  shared_ptr<libcellml::Units> local_1488;
  undefined1 local_1478 [8];
  AssertionResult gtest_ar_10;
  UnitsItemPtr ua;
  shared_ptr<libcellml::UnitsItem> ue;
  Message local_1440 [8];
  shared_ptr<libcellml::Reset> local_1438;
  any local_1428;
  undefined1 local_1418 [8];
  AssertionResult gtest_ar_9;
  Message local_1400 [8];
  shared_ptr<libcellml::Reset> local_13f8;
  any local_13e8;
  undefined1 local_13d8 [8];
  AssertionResult gtest_ar_8;
  Message local_13c0 [8];
  shared_ptr<libcellml::Reset> local_13b8;
  any local_13a8;
  undefined1 local_1398 [8];
  AssertionResult gtest_ar_7;
  Message local_1380 [8];
  shared_ptr<libcellml::Model> local_1378;
  any local_1368;
  undefined1 local_1358 [8];
  AssertionResult gtest_ar_6;
  any local_1338;
  AssertHelper local_1328 [8];
  Message local_1320 [8];
  shared_ptr<libcellml::ImportSource> local_1318;
  any local_1308;
  undefined1 local_12f8 [8];
  AssertionResult gtest_ar_5;
  Message local_12e0 [8];
  shared_ptr<libcellml::Model> local_12d8;
  any local_12c8;
  undefined1 local_12b8 [8];
  AssertionResult gtest_ar_4;
  any local_1298;
  AssertHelper local_1288 [8];
  Message local_1280 [8];
  shared_ptr<libcellml::Component> local_1278;
  any local_1268;
  undefined1 local_1258 [8];
  AssertionResult gtest_ar_3;
  Message local_1240 [8];
  shared_ptr<libcellml::Component> local_1238;
  any local_1228;
  undefined1 local_1218 [8];
  AssertionResult gtest_ar_2;
  Message local_1200 [12];
  CellmlElementType local_11f4;
  undefined1 local_11f0 [8];
  AssertionResult gtest_ar_1;
  AnyCellmlElementPtr item;
  size_t index;
  size_t num;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *id;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Message local_1198 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1190;
  undefined1 local_1178 [8];
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  VariablePairPtr testPair;
  VariablePairPtr pair;
  string local_1130 [32];
  shared_ptr<libcellml::Component> local_1110;
  shared_ptr<libcellml::Reset> local_1100;
  CellmlElementType local_10ec;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_> local_10e8;
  shared_ptr<libcellml::VariablePair> local_10d0;
  CellmlElementType local_10bc;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_10b8;
  CellmlElementType local_109c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_1098;
  shared_ptr<libcellml::VariablePair> local_1080;
  CellmlElementType local_106c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_1068;
  allocator<char> local_1049;
  string local_1048 [32];
  shared_ptr<libcellml::Component> local_1028;
  CellmlElementType local_1014;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_1010;
  allocator<char> local_ff1;
  string local_ff0 [32];
  shared_ptr<libcellml::Component> local_fd0;
  CellmlElementType local_fbc;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_fb8;
  allocator<char> local_f99;
  string local_f98 [32];
  shared_ptr<libcellml::Units> local_f78;
  shared_ptr<libcellml::UnitsItem> local_f68;
  CellmlElementType local_f54;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::UnitsItem>_> local_f50;
  pair<libcellml::CellmlElementType,_std::any> *local_f38;
  pair<libcellml::CellmlElementType,_std::any> local_f30;
  pair<libcellml::CellmlElementType,_std::any> local_f18;
  pair<libcellml::CellmlElementType,_std::any> local_f00;
  pair<libcellml::CellmlElementType,_std::any> local_ee8;
  pair<libcellml::CellmlElementType,_std::any> local_ed0;
  pair<libcellml::CellmlElementType,_std::any> local_eb8;
  pair<libcellml::CellmlElementType,_std::any> local_ea0;
  iterator local_e88;
  _func_void__Op_any_ptr__Arg_ptr *local_e80;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_e78;
  allocator<std::pair<libcellml::CellmlElementType,_std::any>_> local_e5e;
  undefined1 local_e5d;
  CellmlElementType local_e5c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>_> local_e58;
  allocator<char> local_e39;
  string local_e38 [39];
  allocator<char> local_e11;
  string local_e10 [32];
  shared_ptr<libcellml::Component> local_df0;
  shared_ptr<libcellml::Component> local_de0;
  CellmlElementType local_dcc;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_dc8;
  shared_ptr<libcellml::VariablePair> local_db0;
  CellmlElementType local_d9c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_d98;
  CellmlElementType local_d7c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_d78;
  CellmlElementType local_d5c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_d58;
  allocator<char> local_d39;
  string local_d38 [32];
  shared_ptr<libcellml::Units> local_d18;
  CellmlElementType local_d04;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_d00;
  allocator<char> local_ce1;
  string local_ce0 [32];
  shared_ptr<libcellml::Units> local_cc0;
  shared_ptr<libcellml::ImportSource> local_cb0;
  CellmlElementType local_c9c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>_> local_c98;
  pair<libcellml::CellmlElementType,_std::any> *local_c80;
  pair<libcellml::CellmlElementType,_std::any> local_c78;
  pair<libcellml::CellmlElementType,_std::any> local_c60;
  pair<libcellml::CellmlElementType,_std::any> local_c48;
  pair<libcellml::CellmlElementType,_std::any> local_c30;
  pair<libcellml::CellmlElementType,_std::any> local_c18;
  pair<libcellml::CellmlElementType,_std::any> local_c00;
  pair<libcellml::CellmlElementType,_std::any> local_be8;
  iterator local_bd0;
  _func_void__Op_any_ptr__Arg_ptr *local_bc8;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_bc0;
  allocator<std::pair<libcellml::CellmlElementType,_std::any>_> local_ba6;
  undefined1 local_ba5;
  CellmlElementType local_ba4;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_ba0;
  allocator<char> local_b81;
  string local_b80 [32];
  shared_ptr<libcellml::Component> local_b60;
  shared_ptr<libcellml::Reset> local_b50;
  CellmlElementType local_b3c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_> local_b38;
  allocator<char> local_b19;
  string local_b18 [32];
  shared_ptr<libcellml::Component> local_af8;
  CellmlElementType local_ae4;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_ae0;
  CellmlElementType local_ac4;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_ac0;
  shared_ptr<libcellml::VariablePair> local_aa8;
  CellmlElementType local_a94;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_a90;
  allocator<char> local_a71;
  string local_a70 [32];
  shared_ptr<libcellml::Units> local_a50;
  CellmlElementType local_a3c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_a38;
  allocator<char> local_a19;
  string local_a18 [32];
  shared_ptr<libcellml::Units> local_9f8;
  CellmlElementType local_9e4;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_9e0;
  CellmlElementType local_9c4;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>_> local_9c0;
  pair<libcellml::CellmlElementType,_std::any> *local_9a8;
  pair<libcellml::CellmlElementType,_std::any> local_9a0;
  pair<libcellml::CellmlElementType,_std::any> local_988;
  pair<libcellml::CellmlElementType,_std::any> local_970;
  pair<libcellml::CellmlElementType,_std::any> local_958;
  pair<libcellml::CellmlElementType,_std::any> local_940;
  pair<libcellml::CellmlElementType,_std::any> local_928;
  pair<libcellml::CellmlElementType,_std::any> local_910;
  pair<libcellml::CellmlElementType,_std::any> local_8f8;
  iterator local_8e0;
  _func_void__Op_any_ptr__Arg_ptr *local_8d8;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_8d0;
  allocator<std::pair<libcellml::CellmlElementType,_std::any>_> local_8b3;
  undefined1 local_8b2;
  allocator<char> local_8b1;
  string local_8b0 [39];
  allocator<char> local_889;
  string local_888 [39];
  allocator<char> local_861;
  string local_860 [32];
  shared_ptr<libcellml::Component> local_840;
  shared_ptr<libcellml::Component> local_830;
  shared_ptr<libcellml::Variable> local_820;
  CellmlElementType local_80c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_808;
  allocator<char> local_7e9;
  string local_7e8 [39];
  allocator<char> local_7c1;
  string local_7c0 [32];
  shared_ptr<libcellml::Component> local_7a0;
  shared_ptr<libcellml::Component> local_790;
  CellmlElementType local_77c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_778;
  allocator<char> local_759;
  string local_758 [32];
  shared_ptr<libcellml::Component> local_738;
  shared_ptr<libcellml::Reset> local_728;
  CellmlElementType local_714;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_> local_710;
  shared_ptr<libcellml::VariablePair> local_6f8;
  CellmlElementType local_6e4;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_6e0;
  allocator<char> local_6c1;
  string local_6c0 [32];
  shared_ptr<libcellml::Component> local_6a0;
  CellmlElementType local_68c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_688;
  shared_ptr<libcellml::VariablePair> local_670;
  CellmlElementType local_65c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_658;
  allocator<char> local_639;
  string local_638 [32];
  shared_ptr<libcellml::Component> local_618;
  shared_ptr<libcellml::ImportSource> local_608;
  CellmlElementType local_5f4;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>_> local_5f0;
  allocator<char> local_5d1;
  string local_5d0 [32];
  shared_ptr<libcellml::Units> local_5b0;
  CellmlElementType local_59c;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_598;
  pair<libcellml::CellmlElementType,_std::any> *local_580;
  pair<libcellml::CellmlElementType,_std::any> local_578;
  pair<libcellml::CellmlElementType,_std::any> local_560;
  pair<libcellml::CellmlElementType,_std::any> local_548;
  pair<libcellml::CellmlElementType,_std::any> local_530;
  pair<libcellml::CellmlElementType,_std::any> local_518;
  pair<libcellml::CellmlElementType,_std::any> local_500;
  pair<libcellml::CellmlElementType,_std::any> local_4e8;
  pair<libcellml::CellmlElementType,_std::any> local_4d0;
  iterator local_4b8;
  _func_void__Op_any_ptr__Arg_ptr *local_4b0;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *local_490;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_488;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_3e0;
  iterator local_3a8;
  size_type local_3a0;
  undefined1 local_398 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  expectedItems;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [32];
  shared_ptr<libcellml::Component> local_318;
  undefined1 local_308 [8];
  VariablePtr c4v2;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [32];
  shared_ptr<libcellml::Component> local_2a8;
  undefined1 local_298 [8];
  VariablePtr c4v1;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [32];
  shared_ptr<libcellml::Component> local_210;
  shared_ptr<libcellml::Component> local_200;
  undefined1 local_1f0 [8];
  VariablePtr c3v1;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [32];
  shared_ptr<libcellml::Component> local_190;
  undefined1 local_180 [8];
  VariablePtr c2v2;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  shared_ptr<libcellml::Component> local_120;
  undefined1 local_110 [8];
  VariablePtr c2v1;
  ModelPtr model;
  ParserPtr parser;
  allocator<char> local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5 [20];
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  Annotator_retrieveDuplicateIdItemsWithIndex_Test *this_local;
  
  local_c0 = &local_b8;
  ids.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"duplicateId1",&local_c1);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"duplicateId2",local_d5);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"duplicateId3",&local_d6);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"duplicateId4",&local_d7);
  local_38 = &local_b8;
  local_30 = 4;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l_04._M_len = local_30;
  __l_04._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l_04,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7));
  local_15a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_15a8 = local_15a8 + -1;
    std::__cxx11::string::~string((string *)local_15a8);
  } while (local_15a8 != &local_b8);
  std::allocator<char>::~allocator(&local_d7);
  std::allocator<char>::~allocator(&local_d6);
  std::allocator<char>::~allocator(local_d5);
  std::allocator<char>::~allocator(&local_c1);
  this_01 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_01,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_01);
  libcellml::Parser::parseModel
            ((string *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"component2",&local_141);
  libcellml::ComponentEntity::component((string *)&local_120,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"variable1",
             (allocator<char> *)
             ((long)&c2v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_110);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c2v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"component2",&local_1b1);
  libcellml::ComponentEntity::component((string *)&local_190,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"variable2",
             (allocator<char> *)
             ((long)&c3v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_180);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c3v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"component2",&local_231);
  libcellml::ComponentEntity::component((string *)&local_210,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"component3",&local_259);
  libcellml::ComponentEntity::component((string *)&local_200,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,"variable1",
             (allocator<char> *)
             ((long)&c4v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_1f0);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c4v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_200);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_210);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"component4",&local_2c9);
  libcellml::ComponentEntity::component((string *)&local_2a8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f0,"variable1",
             (allocator<char> *)
             ((long)&c4v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_298);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c4v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2a8);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"component4",&local_339);
  libcellml::ComponentEntity::component((string *)&local_318,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,"variable2",
             (allocator<char> *)
             ((long)&expectedItems._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  libcellml::Component::variable((string *)local_308);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expectedItems._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_318);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_1_ = 1;
  local_490 = &local_488;
  local_8b2 = 1;
  local_580 = &local_578;
  local_59c = UNITS;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5d0,"units2",&local_5d1);
  libcellml::Model::units((string *)&local_5b0);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Units>>
            (&local_598,&local_59c,&local_5b0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>(&local_578,&local_598)
  ;
  local_5f4 = IMPORT;
  local_580 = &local_560;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"component1",&local_639);
  libcellml::ComponentEntity::component((string *)&local_618,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_618);
  libcellml::ImportedEntity::importSource();
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::ImportSource>>
            (&local_5f0,&local_5f4,&local_608);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>,_true>
            (&local_560,&local_5f0);
  local_65c = MAP_VARIABLES;
  local_580 = &local_548;
  libcellml::VariablePair::create((shared_ptr *)&local_670,(shared_ptr *)local_298);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::VariablePair>>
            (&local_658,&local_65c,&local_670);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_548,&local_658);
  local_68c = COMPONENT;
  local_580 = &local_530;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"component2",&local_6c1);
  libcellml::ComponentEntity::component((string *)&local_6a0,SUB81(peVar3,0));
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Component>>
            (&local_688,&local_68c,&local_6a0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_530,&local_688);
  local_6e4 = CONNECTION;
  local_580 = &local_518;
  libcellml::VariablePair::create((shared_ptr *)&local_6f8,(shared_ptr *)local_110);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::VariablePair>>
            (&local_6e0,&local_6e4,&local_6f8);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_518,&local_6e0);
  local_714 = TEST_VALUE;
  local_580 = &local_500;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"component2",&local_759);
  libcellml::ComponentEntity::component((string *)&local_738,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_738);
  libcellml::Component::reset((ulong)&local_728);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Reset>>
            (&local_710,&local_714,&local_728);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>,_true>(&local_500,&local_710)
  ;
  local_77c = COMPONENT_REF;
  local_580 = &local_4e8;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"component2",&local_7c1);
  libcellml::ComponentEntity::component((string *)&local_7a0,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e8,"component3",&local_7e9);
  libcellml::ComponentEntity::component((string *)&local_790,SUB81(peVar4,0));
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Component>>
            (&local_778,&local_77c,&local_790);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_4e8,&local_778);
  local_80c = VARIABLE;
  local_580 = &local_4d0;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_860,"component2",&local_861);
  libcellml::ComponentEntity::component((string *)&local_840,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_888,"component3",&local_889);
  libcellml::ComponentEntity::component((string *)&local_830,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8b0,"variable2",&local_8b1);
  libcellml::Component::variable((string *)&local_820);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Variable>>
            (&local_808,&local_80c,&local_820);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_4d0,&local_808);
  local_8b2 = 0;
  local_4b8 = &local_578;
  local_4b0 = (_func_void__Op_any_ptr__Arg_ptr *)0x8;
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::allocator(&local_8b3);
  __l_02._M_len = (size_type)local_4b0;
  __l_02._M_array = local_4b8;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_4a8,__l_02,&local_8b3);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_488,(char (*) [13])"duplicateId1",&local_4a8);
  local_ba5 = 1;
  local_9a8 = &local_9a0;
  local_9c4 = MODEL;
  local_490 = &local_450;
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Model>&>
            (&local_9c0,&local_9c4,
             (shared_ptr<libcellml::Model> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>,_true>(&local_9a0,&local_9c0)
  ;
  local_9e4 = UNITS;
  local_9a8 = &local_988;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a18,"units1",&local_a19);
  libcellml::Model::units((string *)&local_9f8);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Units>>
            (&local_9e0,&local_9e4,&local_9f8);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>(&local_988,&local_9e0)
  ;
  local_a3c = UNITS;
  local_9a8 = &local_970;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a70,"blob",&local_a71);
  libcellml::Model::units((string *)&local_a50);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Units>>
            (&local_a38,&local_a3c,&local_a50);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>(&local_970,&local_a38)
  ;
  local_a94 = CONNECTION;
  local_9a8 = &local_958;
  libcellml::VariablePair::create((shared_ptr *)&local_aa8,(shared_ptr *)local_308);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::VariablePair>>
            (&local_a90,&local_a94,&local_aa8);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_958,&local_a90);
  local_ac4 = VARIABLE;
  local_9a8 = &local_940;
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Variable>&>
            (&local_ac0,&local_ac4,(shared_ptr<libcellml::Variable> *)local_308);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_940,&local_ac0);
  local_ae4 = COMPONENT_REF;
  local_9a8 = &local_928;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b18,"component2",&local_b19);
  libcellml::ComponentEntity::component((string *)&local_af8,SUB81(peVar3,0));
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Component>>
            (&local_ae0,&local_ae4,&local_af8);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_928,&local_ae0);
  local_b3c = RESET;
  local_9a8 = &local_910;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b80,"component2",&local_b81);
  libcellml::ComponentEntity::component((string *)&local_b60,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_b60);
  libcellml::Component::reset((ulong)&local_b50);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Reset>>
            (&local_b38,&local_b3c,&local_b50);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>,_true>(&local_910,&local_b38)
  ;
  local_ba4 = VARIABLE;
  local_9a8 = &local_8f8;
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Variable>&>
            (&local_ba0,&local_ba4,(shared_ptr<libcellml::Variable> *)local_1f0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_8f8,&local_ba0);
  local_ba5 = 0;
  local_8e0 = &local_9a0;
  local_8d8 = (_func_void__Op_any_ptr__Arg_ptr *)0x8;
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::allocator(&local_ba6);
  __l_01._M_len = (size_type)local_8d8;
  __l_01._M_array = local_8e0;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_8d0,__l_01,&local_ba6);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_450,(char (*) [13])"duplicateId2",&local_8d0);
  local_e5d = 1;
  local_c80 = &local_c78;
  local_c9c = IMPORT;
  local_490 = &local_418;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ce0,"units1",&local_ce1);
  libcellml::Model::units((string *)&local_cc0);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_cc0);
  libcellml::ImportedEntity::importSource();
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::ImportSource>>
            (&local_c98,&local_c9c,&local_cb0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>,_true>
            (&local_c78,&local_c98);
  local_d04 = UNITS;
  local_c80 = &local_c60;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d38,"units3",&local_d39);
  libcellml::Model::units((string *)&local_d18);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Units>>
            (&local_d00,&local_d04,&local_d18);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>(&local_c60,&local_d00)
  ;
  local_d5c = VARIABLE;
  local_c80 = &local_c48;
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Variable>&>
            (&local_d58,&local_d5c,(shared_ptr<libcellml::Variable> *)local_298);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_c48,&local_d58);
  local_d7c = VARIABLE;
  local_c80 = &local_c30;
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Variable>&>
            (&local_d78,&local_d7c,(shared_ptr<libcellml::Variable> *)local_180);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_c30,&local_d78);
  local_d9c = MAP_VARIABLES;
  local_c80 = &local_c18;
  libcellml::VariablePair::create((shared_ptr *)&local_db0,(shared_ptr *)local_180);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::VariablePair>>
            (&local_d98,&local_d9c,&local_db0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_c18,&local_d98);
  local_dcc = COMPONENT;
  local_c80 = &local_c00;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e10,"component2",&local_e11);
  libcellml::ComponentEntity::component((string *)&local_df0,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_df0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e38,"component3",&local_e39);
  libcellml::ComponentEntity::component((string *)&local_de0,SUB81(peVar4,0));
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Component>>
            (&local_dc8,&local_dcc,&local_de0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_c00,&local_dc8);
  local_e5c = ENCAPSULATION;
  local_c80 = &local_be8;
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Model>&>
            (&local_e58,&local_e5c,
             (shared_ptr<libcellml::Model> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>,_true>(&local_be8,&local_e58)
  ;
  local_e5d = 0;
  local_bd0 = &local_c78;
  local_bc8 = (_func_void__Op_any_ptr__Arg_ptr *)0x7;
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::allocator(&local_e5e);
  __l_00._M_len = (size_type)local_bc8;
  __l_00._M_array = local_bd0;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_bc0,__l_00,&local_e5e);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_418,(char (*) [13])"duplicateId3",&local_bc0);
  pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 1;
  local_f38 = &local_f30;
  local_f54 = UNIT;
  local_490 = &local_3e0;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f98,"units2",&local_f99);
  libcellml::Model::units((string *)&local_f78);
  libcellml::UnitsItem::create((shared_ptr *)&local_f68,(ulong)&local_f78);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::UnitsItem>>
            (&local_f50,&local_f54,&local_f68);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::UnitsItem>,_true>
            (&local_f30,&local_f50);
  local_fbc = COMPONENT;
  local_f38 = &local_f18;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ff0,"component1",&local_ff1);
  libcellml::ComponentEntity::component((string *)&local_fd0,SUB81(peVar3,0));
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Component>>
            (&local_fb8,&local_fbc,&local_fd0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_f18,&local_fb8);
  local_1014 = COMPONENT;
  local_f38 = &local_f00;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1048,"component4",&local_1049);
  libcellml::ComponentEntity::component((string *)&local_1028,SUB81(peVar3,0));
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Component>>
            (&local_1010,&local_1014,&local_1028);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_f00,&local_1010);
  local_106c = MAP_VARIABLES;
  local_f38 = &local_ee8;
  libcellml::VariablePair::create((shared_ptr *)&local_1080,(shared_ptr *)local_110);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::VariablePair>>
            (&local_1068,&local_106c,&local_1080);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_ee8,&local_1068);
  local_109c = VARIABLE;
  local_f38 = &local_ed0;
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Variable>&>
            (&local_1098,&local_109c,(shared_ptr<libcellml::Variable> *)local_110);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_ed0,&local_1098);
  local_10bc = MAP_VARIABLES;
  local_f38 = &local_eb8;
  libcellml::VariablePair::create((shared_ptr *)&local_10d0,(shared_ptr *)local_180);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::VariablePair>>
            (&local_10b8,&local_10bc,&local_10d0);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_eb8,&local_10b8);
  local_10ec = RESET_VALUE;
  local_f38 = &local_ea0;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1130,"component2",
             (allocator<char> *)
             ((long)&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_1110,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1110);
  libcellml::Component::reset((ulong)&local_1100);
  std::make_pair<libcellml::CellmlElementType,std::shared_ptr<libcellml::Reset>>
            (&local_10e8,&local_10ec,&local_1100);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>,_true>
            (&local_ea0,&local_10e8);
  pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 0;
  local_e88 = &local_f30;
  local_e80 = (_func_void__Op_any_ptr__Arg_ptr *)0x7;
  this_02 = (allocator<std::pair<libcellml::CellmlElementType,_std::any>_> *)
            ((long)&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 5);
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::allocator(this_02);
  __l._M_len = (size_type)local_e80;
  __l._M_array = local_e88;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_e78,__l,this_02);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_3e0,(char (*) [13])"duplicateId4",&local_e78);
  pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_1_ = 0;
  local_3a8 = &local_488;
  local_3a0 = 4;
  this_03 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
             *)((long)&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 2);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  ::allocator(this_03);
  __l_03._M_len = local_3a0;
  __l_03._M_array = local_3a8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
         *)local_398,__l_03,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 3),this_03);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
                *)((long)&pair.
                          super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 2));
  local_1910 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
                *)&local_3a8;
  do {
    local_1910 = local_1910 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
    ::~pair(local_1910);
  } while (local_1910 != &local_488);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_e78);
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::~allocator
            ((allocator<std::pair<libcellml::CellmlElementType,_std::any>_> *)
             ((long)&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  local_1928 = (pair<libcellml::CellmlElementType,_std::any> *)&local_e88;
  do {
    local_1928 = local_1928 + -1;
    std::pair<libcellml::CellmlElementType,_std::any>::~pair(local_1928);
  } while (local_1928 != &local_f30);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_>::~pair(&local_10e8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_1100);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1110);
  std::__cxx11::string::~string(local_1130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_>::~pair
            (&local_10b8);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_10d0);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_>::~pair(&local_1098)
  ;
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_>::~pair
            (&local_1068);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_1080);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_>::~pair
            (&local_1010);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1028);
  std::__cxx11::string::~string(local_1048);
  std::allocator<char>::~allocator(&local_1049);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_>::~pair(&local_fb8)
  ;
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_fd0);
  std::__cxx11::string::~string(local_ff0);
  std::allocator<char>::~allocator(&local_ff1);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::UnitsItem>_>::~pair(&local_f50)
  ;
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_f68);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_f78);
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator(&local_f99);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_bc0);
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::~allocator(&local_e5e);
  local_1940 = (pair<libcellml::CellmlElementType,_std::any> *)&local_bd0;
  do {
    local_1940 = local_1940 + -1;
    std::pair<libcellml::CellmlElementType,_std::any>::~pair(local_1940);
  } while (local_1940 != &local_c78);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>_>::~pair(&local_e58);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_>::~pair(&local_dc8)
  ;
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_de0);
  std::__cxx11::string::~string(local_e38);
  std::allocator<char>::~allocator(&local_e39);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_df0);
  std::__cxx11::string::~string(local_e10);
  std::allocator<char>::~allocator(&local_e11);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_>::~pair
            (&local_d98);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_db0);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_>::~pair(&local_d78);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_>::~pair(&local_d58);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_>::~pair(&local_d00);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_d18);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator(&local_d39);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>_>::~pair
            (&local_c98);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_cb0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_cc0);
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator(&local_ce1);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_8d0);
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::~allocator(&local_ba6);
  local_1958 = (pair<libcellml::CellmlElementType,_std::any> *)&local_8e0;
  do {
    local_1958 = local_1958 + -1;
    std::pair<libcellml::CellmlElementType,_std::any>::~pair(local_1958);
  } while (local_1958 != &local_9a0);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_>::~pair(&local_ba0);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_>::~pair(&local_b38);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_b50);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_b60);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_>::~pair(&local_ae0)
  ;
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_af8);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator(&local_b19);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_>::~pair(&local_ac0);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_>::~pair
            (&local_a90);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_aa8);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_>::~pair(&local_a38);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_a50);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator(&local_a71);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_>::~pair(&local_9e0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_9f8);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>_>::~pair(&local_9c0);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_4a8);
  std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>::~allocator(&local_8b3);
  local_1970 = (pair<libcellml::CellmlElementType,_std::any> *)&local_4b8;
  do {
    local_1970 = local_1970 + -1;
    std::pair<libcellml::CellmlElementType,_std::any>::~pair(local_1970);
  } while (local_1970 != &local_578);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_>::~pair(&local_808);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_820);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_830);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_840);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_>::~pair(&local_778)
  ;
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_790);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_7a0);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_>::~pair(&local_710);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_728);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_738);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_>::~pair
            (&local_6e0);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_6f8);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_>::~pair(&local_688)
  ;
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_6a0);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_>::~pair
            (&local_658);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_670);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>_>::~pair
            (&local_5f0);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_608);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_618);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_>::~pair(&local_598);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_5b0);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::shared_ptr<libcellml::VariablePair>::shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)
             &testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::VariablePair>::shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)
             &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::create();
  peVar5 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::Annotator::setModel((shared_ptr *)peVar5);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Annotator::duplicateIds_abi_cxx11_();
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_1178,"ids","annotator->duplicateIds()",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,&local_1190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1178);
  if (!bVar1) {
    testing::Message::Message(local_1198);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7b2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1,local_1198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1);
    testing::Message::~Message(local_1198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1178);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28);
  id = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&id), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    peVar5 = std::
             __shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             libcellml::Annotator::itemCount((string *)peVar5);
    for (item.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        item.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi < p_Var7;
        item.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = item.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi + 1) {
      peVar5 = std::
               __shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&gtest_ar.message_);
      libcellml::Annotator::item((string *)&gtest_ar_1.message_,(ulong)peVar5);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                             *)local_398,__k);
      lhs = std::
            vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
            ::operator[](pmVar8,(size_type)
                                item.
                                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
      std::
      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&gtest_ar_1.message_);
      local_11f4 = libcellml::AnyCellmlElement::type();
      testing::internal::EqHelper<false>::
      Compare<libcellml::CellmlElementType,libcellml::CellmlElementType>
                ((EqHelper<false> *)local_11f0,"expectedItems[id][index].first","item->type()",
                 &lhs->first,&local_11f4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f0);
      if (!bVar1) {
        testing::Message::Message(local_1200);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_11f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                   ,0x7b9,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_1200);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(local_1200);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f0);
      std::
      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&gtest_ar_1.message_);
      uVar2 = libcellml::AnyCellmlElement::type();
      switch(uVar2) {
      case 0:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Component>>(&local_1228);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::component();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                  ((EqHelper<false> *)local_1218,
                   "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                   "item->component()",(shared_ptr<libcellml::Component> *)&local_1228,&local_1238);
        std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1238);
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)&local_1228);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1218);
        if (!bVar1) {
          testing::Message::Message(local_1240);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1218);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7bd,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,local_1240);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(local_1240);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1218);
        break;
      case 1:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Component>>(&local_1268);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::component();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                  ((EqHelper<false> *)local_1258,
                   "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                   "item->component()",(shared_ptr<libcellml::Component> *)&local_1268,&local_1278);
        std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1278);
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)&local_1268);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1258);
        if (!bVar1) {
          testing::Message::Message(local_1280);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1258);
          testing::internal::AssertHelper::AssertHelper
                    (local_1288,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7c0,pcVar6);
          testing::internal::AssertHelper::operator=(local_1288,local_1280);
          testing::internal::AssertHelper::~AssertHelper(local_1288);
          testing::Message::~Message(local_1280);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1258);
        break;
      case 2:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::VariablePair>>(&local_1298);
        std::shared_ptr<libcellml::VariablePair>::operator=
                  ((shared_ptr<libcellml::VariablePair> *)
                   &testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(shared_ptr<libcellml::VariablePair> *)&local_1298);
        std::shared_ptr<libcellml::VariablePair>::~shared_ptr
                  ((shared_ptr<libcellml::VariablePair> *)&local_1298);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::variablePair();
        std::shared_ptr<libcellml::VariablePair>::operator=
                  ((shared_ptr<libcellml::VariablePair> *)
                   &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(shared_ptr<libcellml::VariablePair> *)&gtest_ar_4.message_);
        std::shared_ptr<libcellml::VariablePair>::~shared_ptr
                  ((shared_ptr<libcellml::VariablePair> *)&gtest_ar_4.message_);
        break;
      case 3:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Model>>(&local_12c8);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::model();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                  ((EqHelper<false> *)local_12b8,
                   "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                   "item->model()",(shared_ptr<libcellml::Model> *)&local_12c8,&local_12d8);
        std::shared_ptr<libcellml::Model>::~shared_ptr(&local_12d8);
        std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&local_12c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12b8);
        if (!bVar1) {
          testing::Message::Message(local_12e0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_12b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7c7,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,local_12e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(local_12e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_12b8);
        break;
      case 4:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::ImportSource>>(&local_1308);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::importSource();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
                  ((EqHelper<false> *)local_12f8,
                   "std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second)",
                   "item->importSource()",(shared_ptr<libcellml::ImportSource> *)&local_1308,
                   &local_1318);
        std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_1318);
        std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                  ((shared_ptr<libcellml::ImportSource> *)&local_1308);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12f8);
        if (!bVar1) {
          testing::Message::Message(local_1320);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_12f8);
          testing::internal::AssertHelper::AssertHelper
                    (local_1328,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7ca,pcVar6);
          testing::internal::AssertHelper::operator=(local_1328,local_1320);
          testing::internal::AssertHelper::~AssertHelper(local_1328);
          testing::Message::~Message(local_1320);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_12f8);
        break;
      case 5:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::VariablePair>>(&local_1338);
        std::shared_ptr<libcellml::VariablePair>::operator=
                  ((shared_ptr<libcellml::VariablePair> *)
                   &testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(shared_ptr<libcellml::VariablePair> *)&local_1338);
        std::shared_ptr<libcellml::VariablePair>::~shared_ptr
                  ((shared_ptr<libcellml::VariablePair> *)&local_1338);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::variablePair();
        std::shared_ptr<libcellml::VariablePair>::operator=
                  ((shared_ptr<libcellml::VariablePair> *)
                   &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(shared_ptr<libcellml::VariablePair> *)&gtest_ar_6.message_);
        std::shared_ptr<libcellml::VariablePair>::~shared_ptr
                  ((shared_ptr<libcellml::VariablePair> *)&gtest_ar_6.message_);
        break;
      case 6:
      case 0xb:
        break;
      case 7:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Model>>(&local_1368);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::model();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                  ((EqHelper<false> *)local_1358,
                   "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                   "item->model()",(shared_ptr<libcellml::Model> *)&local_1368,&local_1378);
        std::shared_ptr<libcellml::Model>::~shared_ptr(&local_1378);
        std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&local_1368);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1358);
        if (!bVar1) {
          testing::Message::Message(local_1380);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1358);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7d1,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_7.message_,local_1380);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(local_1380);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1358);
        break;
      case 8:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Reset>>(&local_13a8);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::reset();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                  ((EqHelper<false> *)local_1398,
                   "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                   "item->reset()",(shared_ptr<libcellml::Reset> *)&local_13a8,&local_13b8);
        std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_13b8);
        std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)&local_13a8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1398);
        if (!bVar1) {
          testing::Message::Message(local_13c0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1398);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7d4,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_8.message_,local_13c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
          testing::Message::~Message(local_13c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1398);
        break;
      case 9:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Reset>>(&local_13e8);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::reset();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                  ((EqHelper<false> *)local_13d8,
                   "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                   "item->reset()",(shared_ptr<libcellml::Reset> *)&local_13e8,&local_13f8);
        std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_13f8);
        std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)&local_13e8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13d8);
        if (!bVar1) {
          testing::Message::Message(local_1400);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_13d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7d7,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,local_1400);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(local_1400);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_13d8);
        break;
      case 10:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Reset>>(&local_1428);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::reset();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                  ((EqHelper<false> *)local_1418,
                   "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                   "item->reset()",(shared_ptr<libcellml::Reset> *)&local_1428,&local_1438);
        std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_1438);
        std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)&local_1428);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1418);
        if (!bVar1) {
          testing::Message::Message(local_1440);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1418);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &ue.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7da,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &ue.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,local_1440);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &ue.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          testing::Message::~Message(local_1440);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1418);
        break;
      case 0xc:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::UnitsItem>>
                  ((any *)&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::unitsItem();
        std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        libcellml::UnitsItem::units();
        std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_10.message_);
        libcellml::UnitsItem::units();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                  ((EqHelper<false> *)local_1478,"ue->units()","ua->units()",&local_1488,&local_1498
                  );
        std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1498);
        std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1488);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1478);
        if (!bVar1) {
          testing::Message::Message(local_14a0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1478);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7df,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,local_14a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(local_14a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1478);
        std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        local_14c0 = libcellml::UnitsItem::index();
        std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_10.message_);
        local_14c8 = libcellml::UnitsItem::index();
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_14b8,"ue->index()","ua->index()",&local_14c0,&local_14c8
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b8);
        if (!bVar1) {
          testing::Message::Message(local_14d0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_14b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7e0,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_12.message_,local_14d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(local_14d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b8);
        std::shared_ptr<libcellml::UnitsItem>::~shared_ptr
                  ((shared_ptr<libcellml::UnitsItem> *)&gtest_ar_10.message_);
        std::shared_ptr<libcellml::UnitsItem>::~shared_ptr
                  ((shared_ptr<libcellml::UnitsItem> *)
                   &ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        break;
      case 0xd:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Units>>(&local_14f8);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::units();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                  ((EqHelper<false> *)local_14e8,
                   "std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second)",
                   "item->units()",(shared_ptr<libcellml::Units> *)&local_14f8,&local_1508);
        std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1508);
        std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&local_14f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
        if (!bVar1) {
          testing::Message::Message(local_1510);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_14e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7e4,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_13.message_,local_1510);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
          testing::Message::~Message(local_1510);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
        break;
      case 0xe:
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                               *)local_398,__k);
        std::
        vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
        ::operator[](pmVar8,(size_type)
                            item.
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        std::any_cast<std::shared_ptr<libcellml::Variable>>(&local_1538);
        std::
        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&gtest_ar_1.message_);
        libcellml::AnyCellmlElement::variable();
        testing::internal::EqHelper<false>::
        Compare<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
                  ((EqHelper<false> *)local_1528,
                   "std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second)",
                   "item->variable()",(shared_ptr<libcellml::Variable> *)&local_1538,&local_1548);
        std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1548);
        std::shared_ptr<libcellml::Variable>::~shared_ptr
                  ((shared_ptr<libcellml::Variable> *)&local_1538);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1528);
        if (!bVar1) {
          testing::Message::Message(local_1550);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1528);
          testing::internal::AssertHelper::AssertHelper
                    (local_1558,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7e7,pcVar6);
          testing::internal::AssertHelper::operator=(local_1558,local_1550);
          testing::internal::AssertHelper::~AssertHelper(local_1558);
          testing::Message::~Message(local_1550);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1528);
      }
      std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
                ((shared_ptr<libcellml::AnyCellmlElement> *)&gtest_ar_1.message_);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)
             &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)
             &testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
          *)local_398);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_308);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_298);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_1f0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_180);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_110);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(Annotator, retrieveDuplicateIdItemsWithIndex)
{
    std::vector<std::string> ids = {
        "duplicateId1",
        "duplicateId2",
        "duplicateId3",
        "duplicateId4",
    };

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringLotsOfDuplicateIds);

    auto c2v1 = model->component("component2")->variable("variable1");
    auto c2v2 = model->component("component2")->variable("variable2");
    auto c3v1 = model->component("component2")->component("component3")->variable("variable1");
    auto c4v1 = model->component("component4")->variable("variable1");
    auto c4v2 = model->component("component4")->variable("variable2");

    std::map<std::string, std::vector<std::pair<libcellml::CellmlElementType, std::any>>> expectedItems = {
        {"duplicateId1", {
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("units2")),
                             std::make_pair(libcellml::CellmlElementType::IMPORT, model->component("component1")->importSource()),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c4v1, c2v1)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component2")),
                             std::make_pair(libcellml::CellmlElementType::CONNECTION, libcellml::VariablePair::create(c2v1, c3v1)),
                             std::make_pair(libcellml::CellmlElementType::TEST_VALUE, model->component("component2")->reset(0)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT_REF, model->component("component2")->component("component3")),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, model->component("component2")->component("component3")->variable("variable2")),
                         }},
        {"duplicateId2", {
                             std::make_pair(libcellml::CellmlElementType::MODEL, model),
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("units1")),
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("blob")),
                             std::make_pair(libcellml::CellmlElementType::CONNECTION, libcellml::VariablePair::create(c4v2, c2v2)),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c4v2),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT_REF, model->component("component2")),
                             std::make_pair(libcellml::CellmlElementType::RESET, model->component("component2")->reset(0)),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c3v1),
                         }},
        {"duplicateId3", {
                             std::make_pair(libcellml::CellmlElementType::IMPORT, model->units("units1")->importSource()),
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("units3")),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c4v1),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c2v2),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c2v2, c4v2)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component2")->component("component3")),
                             std::make_pair(libcellml::CellmlElementType::ENCAPSULATION, model),
                         }},
        {"duplicateId4", {
                             std::make_pair(libcellml::CellmlElementType::UNIT, libcellml::UnitsItem::create(model->units("units2"), 0)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component1")),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component4")),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c2v1, c3v1)),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c2v1),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c2v2, c4v2)),
                             std::make_pair(libcellml::CellmlElementType::RESET_VALUE, model->component("component2")->reset(0)),
                         }},

    };

    libcellml::VariablePairPtr pair;
    libcellml::VariablePairPtr testPair;

    auto annotator = libcellml::Annotator::create();
    annotator->setModel(model);

    EXPECT_EQ(ids, annotator->duplicateIds());

    for (const auto &id : ids) {
        auto num = annotator->itemCount(id);
        for (size_t index = 0; index < num; ++index) {
            libcellml::AnyCellmlElementPtr item = annotator->item(id, index);

            EXPECT_EQ(expectedItems[id][index].first, item->type());

            switch (item->type()) {
            case libcellml::CellmlElementType::COMPONENT:
                EXPECT_EQ(std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second), item->component());
                break;
            case libcellml::CellmlElementType::COMPONENT_REF:
                EXPECT_EQ(std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second), item->component());
                break;
            case libcellml::CellmlElementType::CONNECTION:
                pair = std::any_cast<libcellml::VariablePairPtr>(expectedItems[id][index].second);
                testPair = item->variablePair();
                break;
            case libcellml::CellmlElementType::ENCAPSULATION:
                EXPECT_EQ(std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second), item->model());
                break;
            case libcellml::CellmlElementType::IMPORT:
                EXPECT_EQ(std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second), item->importSource());
                break;
            case libcellml::CellmlElementType::MAP_VARIABLES:
                pair = std::any_cast<libcellml::VariablePairPtr>(expectedItems[id][index].second);
                testPair = item->variablePair();
                break;
            case libcellml::CellmlElementType::MODEL:
                EXPECT_EQ(std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second), item->model());
                break;
            case libcellml::CellmlElementType::RESET:
                EXPECT_EQ(std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second), item->reset());
                break;
            case libcellml::CellmlElementType::RESET_VALUE:
                EXPECT_EQ(std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second), item->reset());
                break;
            case libcellml::CellmlElementType::TEST_VALUE:
                EXPECT_EQ(std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second), item->reset());
                break;
            case libcellml::CellmlElementType::UNIT: {
                auto ue = std::any_cast<libcellml::UnitsItemPtr>(expectedItems[id][index].second);
                auto ua = item->unitsItem();
                EXPECT_EQ(ue->units(), ua->units());
                EXPECT_EQ(ue->index(), ua->index());
                break;
            }
            case libcellml::CellmlElementType::UNITS:
                EXPECT_EQ(std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second), item->units());
                break;
            case libcellml::CellmlElementType::VARIABLE:
                EXPECT_EQ(std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second), item->variable());
                break;
            case libcellml::CellmlElementType::MATH:
            case libcellml::CellmlElementType::UNDEFINED:
                break;
            }
        }
    }
}